

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tick.cpp
# Opt level: O2

void P_Ticker(void)

{
  int iVar1;
  bool bVar2;
  int *piVar3;
  DBot *pDVar4;
  long lVar5;
  player_t *player;
  
  FInterpolator::UpdateInterpolations(&interpolator);
  r_NoInterpolate = true;
  if (paused == 0) {
    bVar2 = P_CheckTickerPaused();
    if (!bVar2) {
      DPSprite::NewTick();
      if (((level._0_8_ & 3) == 0) && ((bglobal._16_1_ & 2) != 0)) {
        bglobal._16_1_ = bglobal._16_1_ & 0xfd ^ 1;
      }
      piVar3 = &DAT_009ba50c;
      for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
        if ((playeringame[lVar5] == true) && (*piVar3 != 0)) goto LAB_004e1fe2;
        piVar3 = piVar3 + 0xa8;
      }
      S_ResumeSound(false);
LAB_004e1fe2:
      P_ResetSightCounters(false);
      R_ClearInterpolationPath();
      r_NoInterpolate = false;
      P_ThinkParticles();
      player = (player_t *)&players;
      for (lVar5 = 0; lVar5 != 8; lVar5 = lVar5 + 1) {
        if (playeringame[lVar5] == true) {
          if ((bglobal._16_1_ & 1) != 0) {
            pDVar4 = GC::ReadBarrier<DBot>((DBot **)&player->Bot);
            if (pDVar4 != (DBot *)0x0) goto LAB_004e2034;
          }
          P_PlayerThink(player);
        }
LAB_004e2034:
        player = player + 1;
      }
      (*(StatusBar->super_DObject)._vptr_DObject[7])();
      FLevelLocals::Tick(&level);
      DThinker::RunThinkers();
      if (((bglobal._16_1_ & 1) == 0) && (((byte)level.flags2 & 0x20) == 0)) {
        P_UpdateSpecials();
        P_RunEffects();
      }
      iVar1 = level.maptime;
      level.time = level.time + 1;
      level.maptime = iVar1 + 1;
      level.totaltime = level.totaltime + 1;
    }
  }
  return;
}

Assistant:

void P_Ticker (void)
{
	int i;

	interpolator.UpdateInterpolations ();
	r_NoInterpolate = true;

	if (!demoplayback)
	{
		// This is a separate slot from the wipe in D_Display(), because this
		// is delayed slightly due to latency. (Even on a singleplayer game!)
//		GSnd->SetSfxPaused(!!playerswiping, 2);
	}

	// run the tic
	if (paused || P_CheckTickerPaused())
		return;

	DPSprite::NewTick();

	// [RH] Frozen mode is only changed every 4 tics, to make it work with A_Tracer().
	if ((level.time & 3) == 0)
	{
		if (bglobal.changefreeze)
		{
			bglobal.freeze ^= 1;
			bglobal.changefreeze = 0;
		}
	}

	// [BC] Do a quick check to see if anyone has the freeze time power. If they do,
	// then don't resume the sound, since one of the effects of that power is to shut
	// off the music.
	for (i = 0; i < MAXPLAYERS; i++ )
	{
		if (playeringame[i] && players[i].timefreezer != 0)
			break;
	}

	if ( i == MAXPLAYERS )
		S_ResumeSound (false);

	P_ResetSightCounters (false);
	R_ClearInterpolationPath();

	// Since things will be moving, it's okay to interpolate them in the renderer.
	r_NoInterpolate = false;

	P_ThinkParticles();	// [RH] make the particles think

	for (i = 0; i<MAXPLAYERS; i++)
		if (playeringame[i] &&
			/*Added by MC: Freeze mode.*/!(bglobal.freeze && players[i].Bot != NULL))
			P_PlayerThink (&players[i]);

	StatusBar->Tick ();		// [RH] moved this here
	level.Tick ();			// [RH] let the level tick
	DThinker::RunThinkers ();

	//if added by MC: Freeze mode.
	if (!bglobal.freeze && !(level.flags2 & LEVEL2_FROZEN))
	{
		P_UpdateSpecials ();
		P_RunEffects ();	// [RH] Run particle effects
	}

	// for par times
	level.time++;
	level.maptime++;
	level.totaltime++;
}